

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module.cpp
# Opt level: O0

BOOL LOADFreeLibrary(MODSTRUCT *module,BOOL fCallDllMain)

{
  int iVar1;
  BOOL BVar2;
  code *pcVar3;
  PUNREGISTER_MODULE unregisterModule;
  BOOL retval;
  BOOL fCallDllMain_local;
  MODSTRUCT *module_local;
  
  unregisterModule._0_4_ = 0;
  LockModuleList();
  iVar1 = Volatile::operator_cast_to_int((Volatile *)&terminator);
  if (iVar1 == 0) {
    BVar2 = LOADValidateModule(module);
    if (BVar2 == 0) {
      if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
        abort();
      }
      SetLastError(6);
    }
    else if (module->refcount == -1) {
      unregisterModule._0_4_ = 1;
    }
    else {
      module->refcount = module->refcount + -1;
      if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
        abort();
      }
      if (module->refcount == 0) {
        if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
          abort();
        }
        module->prev->next = module->next;
        module->next->prev = module->prev;
        module->self = (HMODULE)0x0;
        if ((fCallDllMain != 0) && (module->pDllMain != (PDLLMAIN)0x0)) {
          LOADCallDllMainSafe(module,0,(LPVOID)0x0);
        }
        if (module->hinstance != (HINSTANCE)0x0) {
          pcVar3 = (code *)dlsym(module->dl_handle,"PAL_UnregisterModule");
          if (pcVar3 != (code *)0x0) {
            (*pcVar3)(module->hinstance);
          }
          module->hinstance = (HINSTANCE)0x0;
        }
        if (module->dl_handle != (void *)0x0) {
          iVar1 = dlclose(module->dl_handle);
          if (iVar1 != 0) {
            if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
              abort();
            }
            dlerror();
          }
        }
        CorUnix::InternalFree(module->lib_name);
        CorUnix::InternalFree(module);
        unregisterModule._0_4_ = 1;
      }
      else {
        unregisterModule._0_4_ = 1;
      }
    }
  }
  else {
    unregisterModule._0_4_ = 1;
  }
  UnlockModuleList();
  return (BOOL)unregisterModule;
}

Assistant:

static BOOL LOADFreeLibrary(MODSTRUCT *module, BOOL fCallDllMain)
{
    BOOL retval = FALSE;

    LockModuleList();

    if (terminator)
    {
        /* PAL shutdown is in progress - ignore FreeLibrary calls */
        retval = TRUE;
        goto done;
    }

    if (!LOADValidateModule(module))
    {
        TRACE("Can't free invalid module %p\n", module);
        SetLastError(ERROR_INVALID_HANDLE);
        goto done;
    }

    if (module->refcount == -1)
    {
        /* special module - never released */
        retval = TRUE;
        goto done;
    }

    module->refcount--;
    TRACE("Reference count for module %p (named %S) decreases to %d\n",
            module, MODNAME(module), module->refcount);

    if (module->refcount != 0)
    {
        retval = TRUE;
        goto done;
    }

    /* Releasing the last reference : call dlclose(), remove module from the
       process-wide module list */

    TRACE("Reference count for module %p (named %S) now 0; destroying module structure\n",
        module, MODNAME(module));

    /* unlink the module structure from the list */
    module->prev->next = module->next;
    module->next->prev = module->prev;

    /* remove the circular reference so that LOADValidateModule will fail */
    module->self = nullptr;

    /* Call DllMain if the module contains one */
    if (fCallDllMain && module->pDllMain)
    {
        LOADCallDllMainSafe(module, DLL_PROCESS_DETACH, nullptr);
    }

    if (module->hinstance)
    {
        PUNREGISTER_MODULE unregisterModule = (PUNREGISTER_MODULE)dlsym(module->dl_handle, "PAL_UnregisterModule");
        if (unregisterModule != nullptr)
        {
             unregisterModule(module->hinstance);
        }
        module->hinstance = nullptr;
    }

    if (module->dl_handle && 0 != dlclose(module->dl_handle))
    {
        /* report dlclose() failure, but proceed anyway. */
        WARN("dlclose() call failed! error message is \"%s\"\n", dlerror());
    }

    /* release all memory */
    InternalFree(module->lib_name);
    InternalFree(module);

    retval = TRUE;

done:
    UnlockModuleList();
    return retval;
}